

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_GlobalXpubTest_Test::TestBody(Psbt_GlobalXpubTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  AssertHelper local_be8;
  Message local_be0;
  string local_bd8;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_14;
  ByteData value;
  string local_b88;
  undefined1 local_b68 [8];
  ByteData key;
  AssertionResult gtest_ar_13;
  CfdException *except_4;
  Message local_b20;
  ByteData local_b18;
  string local_b00;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar_12;
  Message local_ac8;
  string local_ac0;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar_11;
  Message local_a88;
  ExtPubkey local_a80;
  string local_a10;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_10;
  Message local_9d8;
  ByteData local_9d0;
  string local_9b8;
  undefined1 local_998 [8];
  AssertionResult gtest_ar_9;
  Message local_980;
  string local_978;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_8;
  Message local_940;
  ExtPubkey local_938;
  string local_8c8;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_7;
  Message local_890;
  size_type local_888;
  int local_87c;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_6;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> extkey_list;
  AssertionResult gtest_ar_5;
  CfdException *except_3;
  string local_820;
  ByteData local_800;
  allocator local_7e1;
  string local_7e0;
  undefined1 local_7c0 [8];
  KeyData key_data2;
  string local_668;
  undefined1 local_648 [8];
  ExtPubkey ext_pubkey2;
  AssertionResult gtest_ar_4;
  CfdException *except_2;
  Message local_5a8;
  ByteData local_5a0;
  string local_588;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_3;
  Message local_550;
  string local_548;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_2;
  KeyData get_data;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  string local_350;
  ByteData local_330;
  allocator local_311;
  string local_310;
  undefined1 local_2f0 [8];
  KeyData key_data;
  AssertionResult gtest_ar;
  CfdException *except;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  string local_128;
  undefined1 local_108 [8];
  ExtPubkey ext_pubkey;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Psbt psbt;
  Psbt_GlobalXpubTest_Test *this_local;
  
  psbt.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
             ,&local_81);
  cfd::core::Psbt::Psbt((Psbt *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_128,
             "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C"
             ,(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_108,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = cfd::core::Psbt::IsFindGlobalXpubkey((Psbt *)local_60,(ExtPubkey *)local_108);
  local_141 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&except,(internal *)local_140,
               (AssertionResult *)"psbt.IsFindGlobalXpubkey(ext_pubkey)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x48e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&except);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"0/44",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"b7665978",(allocator *)((long)&except_1 + 7));
  cfd::core::ByteData::ByteData(&local_330,&local_350);
  cfd::core::KeyData::KeyData((KeyData *)local_2f0,(ExtPubkey *)local_108,&local_310,&local_330);
  cfd::core::ByteData::~ByteData(&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)((long)&except_1 + 7));
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  cfd::core::Psbt::SetGlobalXpubkey((Psbt *)local_60,(KeyData *)local_2f0);
  cfd::core::KeyData::~KeyData((KeyData *)local_2f0);
  local_391 = cfd::core::Psbt::IsFindGlobalXpubkey((Psbt *)local_60,(ExtPubkey *)local_108);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &get_data.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_390,
               (AssertionResult *)"psbt.IsFindGlobalXpubkey(ext_pubkey)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x49b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string
              ((string *)
               &get_data.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  cfd::core::Psbt::GetGlobalXpubkeyBip32
            ((KeyData *)&gtest_ar_2.message_,(Psbt *)local_60,(ExtPubkey *)local_108);
  cfd::core::KeyData::GetBip32Path_abi_cxx11_
            (&local_548,(KeyData *)&gtest_ar_2.message_,kApostrophe,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_528,"\"0/44\"","get_data.GetBip32Path().c_str()","0/44",pcVar2);
  std::__cxx11::string::~string((string *)&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x49d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  cfd::core::KeyData::GetFingerprint(&local_5a0,(KeyData *)&gtest_ar_2.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_588,&local_5a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_568,"\"b7665978\"","get_data.GetFingerprint().GetHex().c_str()",
             "b7665978",pcVar2);
  std::__cxx11::string::~string((string *)&local_588);
  cfd::core::ByteData::~ByteData(&local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x49e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_2,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_2);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_2.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_668,
             "xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX"
             ,(allocator *)
              ((long)&key_data2.fingerprint_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_648,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key_data2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e0,"0/44\'",&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820,"ae05dbb7",(allocator *)((long)&except_3 + 7));
  cfd::core::ByteData::ByteData(&local_800,&local_820);
  cfd::core::KeyData::KeyData((KeyData *)local_7c0,(ExtPubkey *)local_648,&local_7e0,&local_800);
  cfd::core::ByteData::~ByteData(&local_800);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)((long)&except_3 + 7));
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  cfd::core::Psbt::SetGlobalXpubkey((Psbt *)local_60,(KeyData *)local_7c0);
  cfd::core::KeyData::~KeyData((KeyData *)local_7c0);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_648);
  cfd::core::Psbt::GetGlobalXpubkeyDataList
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&gtest_ar_6.message_
             ,(Psbt *)local_60);
  local_87c = 2;
  local_888 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                        ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                         &gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_878,"2","extkey_list.size()",&local_87c,&local_888);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x4ad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  sVar3 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                    ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                     &gtest_ar_6.message_);
  if (sVar3 == 2) {
    pvVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                        &gtest_ar_6.message_,0);
    cfd::core::KeyData::GetExtPubkey(&local_938,pvVar4);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_8c8,&local_938);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_8a8,
               "\"xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C\""
               ,"extkey_list[0].GetExtPubkey().ToString().c_str()",
               "xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C"
               ,pcVar2);
    std::__cxx11::string::~string((string *)&local_8c8);
    cfd::core::ExtPubkey::~ExtPubkey(&local_938);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
    if (!bVar1) {
      testing::Message::Message(&local_940);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x4af,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_940);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_940);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
    pvVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                        &gtest_ar_6.message_,0);
    cfd::core::KeyData::GetBip32Path_abi_cxx11_(&local_978,pvVar4,kApostrophe,false);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_958,"\"0/44\"","extkey_list[0].GetBip32Path().c_str()","0/44",
               pcVar2);
    std::__cxx11::string::~string((string *)&local_978);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
    if (!bVar1) {
      testing::Message::Message(&local_980);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_958);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x4b0,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_980);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_980);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
    pvVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                        &gtest_ar_6.message_,0);
    cfd::core::KeyData::GetFingerprint(&local_9d0,pvVar4);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_9b8,&local_9d0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_998,"\"b7665978\"",
               "extkey_list[0].GetFingerprint().GetHex().c_str()","b7665978",pcVar2);
    std::__cxx11::string::~string((string *)&local_9b8);
    cfd::core::ByteData::~ByteData(&local_9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
    if (!bVar1) {
      testing::Message::Message(&local_9d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x4b1,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_9d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_9d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
    pvVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                        &gtest_ar_6.message_,1);
    cfd::core::KeyData::GetExtPubkey(&local_a80,pvVar4);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_a10,&local_a80);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_9f0,
               "\"xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX\""
               ,"extkey_list[1].GetExtPubkey().ToString().c_str()",
               "xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX"
               ,pcVar2);
    std::__cxx11::string::~string((string *)&local_a10);
    cfd::core::ExtPubkey::~ExtPubkey(&local_a80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
    if (!bVar1) {
      testing::Message::Message(&local_a88);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x4b3,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_a88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_a88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
    pvVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                        &gtest_ar_6.message_,1);
    cfd::core::KeyData::GetBip32Path_abi_cxx11_(&local_ac0,pvVar4,kApostrophe,false);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_aa0,"\"0/44\'\"","extkey_list[1].GetBip32Path().c_str()","0/44\'",
               pcVar2);
    std::__cxx11::string::~string((string *)&local_ac0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
    if (!bVar1) {
      testing::Message::Message(&local_ac8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_aa0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x4b4,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_ac8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_ac8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
    pvVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                        &gtest_ar_6.message_,1);
    cfd::core::KeyData::GetFingerprint(&local_b18,pvVar4);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_b00,&local_b18);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_ae0,"\"ae05dbb7\"",
               "extkey_list[1].GetFingerprint().GetHex().c_str()","ae05dbb7",pcVar2);
    std::__cxx11::string::~string((string *)&local_b00);
    cfd::core::ByteData::~ByteData(&local_b18);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
    if (!bVar1) {
      testing::Message::Message(&local_b20);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&except_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x4b5,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&except_4,&local_b20);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_4);
      testing::Message::~Message(&local_b20);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&gtest_ar_6.message_
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b88,
             "010488b21e0691fe4d298000002cb26a08008723cc8f19ac08bce635c087d63d738b63c33e62186d43cf3a5805f302e9156620b5b29e8272e86f1d81fb07d6c57c557cbc25218dfde33ab8cea06b7b"
             ,(allocator *)
              ((long)&value.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_b68,&local_b88);
  std::__cxx11::string::~string((string *)&local_b88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&value.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::GetGlobalRecord
            ((ByteData *)&gtest_ar_14.message_,(Psbt *)local_60,(ByteData *)local_b68);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_bd8,(ByteData *)&gtest_ar_14.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_bb8,"\"ae05dbb7000000002c000080\"","value.GetHex().c_str()",
             "ae05dbb7000000002c000080",pcVar2);
  std::__cxx11::string::~string((string *)&local_bd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x4bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_be8,&local_be0);
    testing::internal::AssertHelper::~AssertHelper(&local_be8);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_14.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_b68);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_108);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  return;
}

Assistant:

TEST(Psbt, GlobalXpubTest) {
  Psbt psbt("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==");

  ExtPubkey ext_pubkey("xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C");

  try {
    EXPECT_FALSE(psbt.IsFindGlobalXpubkey(ext_pubkey));
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    KeyData key_data(ext_pubkey, "0/44", ByteData("b7665978"));
    psbt.SetGlobalXpubkey(key_data);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    EXPECT_TRUE(psbt.IsFindGlobalXpubkey(ext_pubkey));
    auto get_data = psbt.GetGlobalXpubkeyBip32(ext_pubkey);
    EXPECT_STREQ("0/44", get_data.GetBip32Path().c_str());
    EXPECT_STREQ("b7665978", get_data.GetFingerprint().GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    ExtPubkey ext_pubkey2("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX");
    KeyData key_data2(ext_pubkey2, "0/44'", ByteData("ae05dbb7"));
    psbt.SetGlobalXpubkey(key_data2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    auto extkey_list = psbt.GetGlobalXpubkeyDataList();
    EXPECT_EQ(2, extkey_list.size());
    if (extkey_list.size() == 2) {
      EXPECT_STREQ("xpub6EkLrUTiaMiLbMAkbLN2BdH4hWkCQT7fLQf3Q6Ymx3gAqbuFeSKHfTMVDtjcsuRtEFqJbAsjYFZMrqeDLgRSsn4yuQygK44HWPrnA7gZC2C", extkey_list[0].GetExtPubkey().ToString().c_str());
      EXPECT_STREQ("0/44", extkey_list[0].GetBip32Path().c_str());
      EXPECT_STREQ("b7665978", extkey_list[0].GetFingerprint().GetHex().c_str());

      EXPECT_STREQ("xpub6JNQxQDHv2vcUQiXjggbaGYZg3nmxX6ojMcJPSs4KfLSLnMBCg8VbJUh5n4to2SwLWXdSXnHBkUQx1fVnJ9oKYjPPYAQehjWRpx6ErQyykX", extkey_list[1].GetExtPubkey().ToString().c_str());
      EXPECT_STREQ("0/44'", extkey_list[1].GetBip32Path().c_str());
      EXPECT_STREQ("ae05dbb7", extkey_list[1].GetFingerprint().GetHex().c_str());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  ByteData key("010488b21e0691fe4d298000002cb26a08008723cc8f19ac08bce635c087d63d738b63c33e62186d43cf3a5805f302e9156620b5b29e8272e86f1d81fb07d6c57c557cbc25218dfde33ab8cea06b7b");
  auto value = psbt.GetGlobalRecord(key);
  EXPECT_STREQ("ae05dbb7000000002c000080", value.GetHex().c_str());
}